

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeTypeUrlOrFullTypeName
          (ParserImpl *this,string *name)

{
  bool bVar1;
  string part;
  string connector;
  allocator<char> local_71;
  string local_70;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  bVar1 = ConsumeIdentifier(this,name);
  if (bVar1) {
    while( true ) {
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,".",&local_71);
      bVar1 = TryConsume(this,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      if (!bVar1) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"/",&local_71);
        bVar1 = TryConsume(this,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        if (!bVar1) {
          std::__cxx11::string::~string((string *)&local_50);
          return true;
        }
      }
      std::__cxx11::string::assign((char *)&local_50);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      bVar1 = ConsumeIdentifier(this,&local_70);
      if (!bVar1) break;
      std::__cxx11::string::append((string *)name);
      std::__cxx11::string::append((string *)name);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return false;
}

Assistant:

bool ConsumeTypeUrlOrFullTypeName(std::string* name) {
    DO(ConsumeIdentifier(name));
    while (true) {
      std::string connector;
      if (TryConsume(".")) {
        connector = ".";
      } else if (TryConsume("/")) {
        connector = "/";
      } else {
        break;
      }
      std::string part;
      DO(ConsumeIdentifier(&part));
      *name += connector;
      *name += part;
    }
    return true;
  }